

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O1

REF_STATUS ref_grid_inspect(REF_GRID_conflict ref_grid)

{
  printf("ref_grid = %p\n",ref_grid);
  printf(" %d node\n",(ulong)(uint)ref_grid->node->n);
  printf(" %d tet\n",(ulong)(uint)ref_grid->cell[8]->n);
  printf(" %d pyr\n",(ulong)(uint)ref_grid->cell[9]->n);
  printf(" %d pri\n",(ulong)(uint)ref_grid->cell[10]->n);
  printf(" %d hex\n",(ulong)(uint)ref_grid->cell[0xb]->n);
  printf(" %d edg\n",(ulong)(uint)ref_grid->cell[0]->n);
  printf(" %d ed2\n",(ulong)(uint)ref_grid->cell[1]->n);
  printf(" %d ed3\n",(ulong)(uint)ref_grid->cell[2]->n);
  printf(" %d tri\n",(ulong)(uint)ref_grid->cell[3]->n);
  printf(" %d qua\n",(ulong)(uint)ref_grid->cell[6]->n);
  printf(" %d geom\n",(ulong)(uint)ref_grid->geom->n);
  printf(" %p gather\n",ref_grid->gather->grid_file);
  printf(" %p adapt\n",ref_grid->adapt);
  printf(" %p interp\n",ref_grid->interp);
  printf(" %d partitioner\n",(ulong)ref_grid->partitioner);
  printf(" %d partitioner seed\n",(ulong)(uint)ref_grid->partitioner_seed);
  printf(" %d partitioner full\n",(ulong)(uint)ref_grid->partitioner_full);
  printf(" %d mesb_version\n",(ulong)(uint)ref_grid->meshb_version);
  printf(" %d twod\n",(ulong)(uint)ref_grid->twod);
  printf(" %d surf\n",(ulong)(uint)ref_grid->surf);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_grid_inspect(REF_GRID ref_grid) {
  printf("ref_grid = %p\n", (void *)ref_grid);
  printf(" %d node\n", ref_node_n(ref_grid_node(ref_grid)));
  printf(" %d tet\n", ref_cell_n(ref_grid_tet(ref_grid)));
  printf(" %d pyr\n", ref_cell_n(ref_grid_pyr(ref_grid)));
  printf(" %d pri\n", ref_cell_n(ref_grid_pri(ref_grid)));
  printf(" %d hex\n", ref_cell_n(ref_grid_hex(ref_grid)));
  printf(" %d edg\n", ref_cell_n(ref_grid_edg(ref_grid)));
  printf(" %d ed2\n", ref_cell_n(ref_grid_ed2(ref_grid)));
  printf(" %d ed3\n", ref_cell_n(ref_grid_ed3(ref_grid)));
  printf(" %d tri\n", ref_cell_n(ref_grid_tri(ref_grid)));
  printf(" %d qua\n", ref_cell_n(ref_grid_qua(ref_grid)));
  printf(" %d geom\n", ref_geom_n(ref_grid_geom(ref_grid)));
  printf(" %p gather\n", (void *)(ref_grid_gather(ref_grid)->grid_file));
  printf(" %p adapt\n", (void *)(ref_grid->adapt));
  printf(" %p interp\n", (void *)(ref_grid->interp));
  printf(" %d partitioner\n", (int)(ref_grid->partitioner));
  printf(" %d partitioner seed\n", (int)(ref_grid->partitioner_seed));
  printf(" %d partitioner full\n", (int)(ref_grid->partitioner_full));
  printf(" %d mesb_version\n", (ref_grid->meshb_version));
  printf(" %d twod\n", (ref_grid->twod));
  printf(" %d surf\n", (ref_grid->surf));

  return REF_SUCCESS;
}